

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFile.cpp
# Opt level: O0

ssize_t __thiscall
blc::tools::VFile::read_abi_cxx11_(VFile *this,int __fd,void *__buf,size_t __nbytes)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  int iVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *tmp;
  string *in_stack_00000118;
  exception *in_stack_00000120;
  VFile *pVVar5;
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(in_register_00000034,__fd);
  if (((byte)this_00[0x13]._M_dataplus & 1) != 0) {
    pVVar5 = this;
    uVar4 = __cxa_allocate_exception(0x78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)pVVar5,(allocator<char> *)this);
    error::exception::exception(in_stack_00000120,in_stack_00000118);
    __cxa_throw(uVar4,&error::exception::typeinfo,error::exception::~exception);
  }
  iVar2 = *(int *)((long)&this_00[0x11].field_2 + 8);
  pVVar5 = this;
  uVar3 = std::__cxx11::string::size();
  if (uVar3 < (ulong)(long)iVar2) {
    uVar4 = __cxa_allocate_exception(0x78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)pVVar5,(allocator<char> *)this);
    error::exception::exception(in_stack_00000120,in_stack_00000118);
    __cxa_throw(uVar4,&error::exception::typeinfo,error::exception::~exception);
  }
  pbVar1 = this_00 + 0x10;
  std::__cxx11::string::find_first_of((char)this_00 + '\x18',10);
  std::__cxx11::string::substr((ulong)this,(ulong)((long)&pbVar1->field_2 + 8));
  iVar2 = std::__cxx11::string::size();
  *(int *)((long)&this_00[0x11].field_2 + 8) =
       *(int *)((long)&this_00[0x11].field_2 + 8) + iVar2 + 1;
  return (ssize_t)pVVar5;
}

Assistant:

std::string blc::tools::VFile::read() const {
	if (!this->_isClosed) {
		if (this->_cursor <= this->_cache.size()) {
			std::string tmp = this->_cache.substr(this->_cursor, this->_cache.find_first_of('\n', this->_cursor) - this->_cursor);
			( const_cast <VFile*> (this) )->_cursor += tmp.size() + 1;
			return tmp;
		} else {
			throw blc::error::exception("Cursor exeeds the size of file");
		}
	} else {
		throw blc::error::exception("Attempt to read a closed virtual file");
	}
}